

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNDely.cpp
# Opt level: O3

void __thiscall NaPNDelay::action(NaPNDelay *this)

{
  NaReal NVar1;
  uint iOffset;
  int iVar2;
  int iVar3;
  NaVector *pNVar4;
  NaVector *pNVar5;
  undefined4 extraout_var;
  NaReal *pNVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  undefined8 uVar11;
  
  pNVar4 = NaPetriCnInput::data(&this->in);
  iOffset = (*pNVar4->_vptr_NaVector[6])(pNVar4);
  pNVar4 = &this->vBuffer;
  NaVector::shift(pNVar4,iOffset);
  if (iOffset != 0) {
    uVar10 = 0;
    do {
      pNVar5 = NaPetriCnInput::data(&this->in);
      iVar2 = (*pNVar5->_vptr_NaVector[8])(pNVar5,uVar10);
      NVar1 = *(NaReal *)CONCAT44(extraout_var,iVar2);
      pNVar6 = NaVector::operator[](pNVar4,(uint)uVar10);
      *pNVar6 = NVar1;
      uVar8 = (uint)uVar10 + 1;
      uVar10 = (ulong)uVar8;
    } while (iOffset != uVar8);
  }
  if ((this->bSleepValue == true) && (this->bSleepValue1st == true)) {
    uVar8 = NaPetriNode::activations(&this->super_NaPetriNode);
    if (uVar8 == 0) {
      uVar8 = this->nMaxLag;
      if (uVar8 != 0) {
        uVar7 = 1;
        uVar9 = iOffset;
        do {
          if (iOffset != 0) {
            uVar8 = 0;
            do {
              pNVar6 = NaVector::operator[](pNVar4,uVar8);
              NVar1 = *pNVar6;
              pNVar6 = NaVector::operator[](pNVar4,uVar8 + uVar9);
              *pNVar6 = NVar1;
              uVar8 = uVar8 + 1;
            } while (uVar8 != iOffset);
            uVar8 = this->nMaxLag;
          }
          uVar7 = uVar7 + 1;
          uVar9 = uVar9 + iOffset;
        } while (uVar7 <= uVar8);
      }
    }
  }
  uVar8 = this->nOutDim;
  if (uVar8 != 0) {
    iVar2 = 0;
    uVar10 = 0;
    do {
      if (iOffset != 0) {
        uVar8 = 0;
        do {
          pNVar6 = NaVector::operator[](pNVar4,this->piOutMap[uVar10] * iOffset + uVar8);
          NVar1 = *pNVar6;
          pNVar5 = NaPetriCnOutput::data(&this->dout);
          iVar3 = (*pNVar5->_vptr_NaVector[8])(pNVar5,(ulong)(iVar2 + uVar8));
          *(NaReal *)CONCAT44(extraout_var_00,iVar3) = NVar1;
          uVar8 = uVar8 + 1;
        } while (iOffset != uVar8);
        uVar8 = this->nOutDim;
      }
      uVar10 = uVar10 + 1;
      iVar2 = iVar2 + iOffset;
    } while (uVar10 < uVar8);
  }
  if (this->bAwaken == false) {
    uVar11 = 0xbff0000000000000;
  }
  else {
    uVar11 = 0x3ff0000000000000;
  }
  pNVar4 = NaPetriCnOutput::data(&this->sync);
  iVar2 = (*pNVar4->_vptr_NaVector[8])(pNVar4,0);
  *(undefined8 *)CONCAT44(extraout_var_01,iVar2) = uVar11;
  return;
}

Assistant:

void
NaPNDelay::action ()
{
    // Portion size
    unsigned	nSize = in.data().dim();

    // Make free space in buffer area
    vBuffer.shift(nSize);

    // Copy input data to buffer
    unsigned    i, j;
    for(i = 0; i < nSize; ++i)
      {
        vBuffer[i] = in.data()[i];
      }

    // If 1st input should be used for all delays
    if(bSleepValue && bSleepValue1st && 0 == activations()) {
	for(j = 1; j <= nMaxLag; ++j)
	    for(i = 0; i < nSize; ++i)
		vBuffer[i + nSize * j] = vBuffer[i];
    }

    // Copy selected portions of stored data to output
    for(j = 0; j < nOutDim; ++j)
      for(i = 0; i < nSize; ++i)
	{
	  dout.data()[j * nSize + i] = vBuffer[piOutMap[j] * nSize + i];
	}

    // Sleep/awaken related nodes
    if(bAwaken){
        sync.data()[0] = 1.0;   // Let linked nodes to deliver data
    }else{
        sync.data()[0] = -1.0;  // Force to be passive linked nodes
    }
}